

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttrack.h
# Opt level: O0

void __thiscall
drace::detector::Fasttrack<std::shared_mutex>::finalize(Fasttrack<std::shared_mutex> *this)

{
  lock_guard<ipc::spinlock> local_20;
  lock_guard<ipc::spinlock> lg2;
  lock_guard<std::shared_mutex> lg1;
  Fasttrack<std::shared_mutex> *this_local;
  
  std::lock_guard<std::shared_mutex>::lock_guard
            ((lock_guard<std::shared_mutex> *)&lg2,&this->g_lock);
  std::lock_guard<ipc::spinlock>::lock_guard(&local_20,&this->vars_spl);
  phmap::container_internal::
  parallel_hash_set<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::NodeHashMapPolicy<unsigned_long,_VarState>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VarState>_>_>
  ::clear((parallel_hash_set<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::NodeHashMapPolicy<unsigned_long,_VarState>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VarState>_>_>
           *)&this->vars);
  std::lock_guard<ipc::spinlock>::~lock_guard(&local_20);
  phmap::container_internal::
  raw_hash_set<phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
  ::clear((raw_hash_set<phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
           *)&this->locks);
  phmap::container_internal::
  parallel_hash_set<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
  ::clear((parallel_hash_set<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
           *)&this->happens_states);
  phmap::container_internal::
  parallel_hash_set<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ::clear((parallel_hash_set<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
           *)&this->allocs);
  phmap::container_internal::
  raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
  ::clear((raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
           *)&this->threads);
  if ((this->log_flag & 1U) != 0) {
    process_log_output(this);
  }
  std::lock_guard<std::shared_mutex>::~lock_guard((lock_guard<std::shared_mutex> *)&lg2);
  return;
}

Assistant:

void finalize() final {
    std::lock_guard<LockT> lg1(g_lock);
    {
      std::lock_guard<ipc::spinlock> lg2(vars_spl);
      vars.clear();
    }
    locks.clear();
    happens_states.clear();
    allocs.clear();
    threads.clear();

    if (log_flag) {
      process_log_output();
    }
  }